

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadControllerLibrary(ColladaParser *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  undefined4 extraout_var_00;
  string id;
  key_type kStack_1e8;
  Controller local_1c8;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    do {
      while( true ) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar2 == '\0') {
          return;
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar2 != 1) break;
        bVar1 = IsElement(this,"controller");
        if (bVar1) {
          uVar3 = GetAttribute(this,"id");
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          std::__cxx11::string::string
                    ((string *)&kStack_1e8,(char *)CONCAT44(extraout_var,iVar2),
                     (allocator *)&local_1c8);
          memset(&local_1c8,0,0x198);
          local_1c8.mMeshId.field_2._M_local_buf[0] = '\0';
          local_1c8.mJointNameSource._M_dataplus._M_p = (pointer)&local_1c8.mJointNameSource.field_2
          ;
          local_1c8.mJointNameSource.field_2._M_local_buf[0] = '\0';
          local_1c8.mJointOffsetMatrixSource._M_dataplus._M_p =
               (pointer)&local_1c8.mJointOffsetMatrixSource.field_2;
          local_1c8.mJointOffsetMatrixSource.field_2._M_local_buf[0] = '\0';
          local_1c8.mWeightInputJoints.mAccessor._M_dataplus._M_p =
               (pointer)&local_1c8.mWeightInputJoints.mAccessor.field_2;
          local_1c8.mWeightInputJoints.mAccessor.field_2._M_local_buf[0] = '\0';
          local_1c8.mWeightInputJoints.mResolved = (Accessor *)0x0;
          local_1c8.mWeightInputJoints.mIndex = 0;
          local_1c8.mWeightInputJoints.mOffset = 0;
          local_1c8.mWeightInputWeights.mAccessor._M_dataplus._M_p =
               (pointer)&local_1c8.mWeightInputWeights.mAccessor.field_2;
          local_1c8.mWeightInputWeights.mAccessor.field_2._M_local_buf[0] = '\0';
          local_1c8.mWeightInputWeights.mIndex = 0;
          local_1c8.mWeightInputWeights.mOffset = 0;
          local_1c8.mWeights.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1c8.mWeights.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1c8.mWeightCounts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1c8.mWeightCounts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1c8.mWeightInputWeights.mResolved = (Accessor *)0x0;
          local_1c8.mWeightCounts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1c8.mWeights.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1c8.mMorphTarget._M_dataplus._M_p = (pointer)&local_1c8.mMorphTarget.field_2;
          local_1c8.mMorphTarget.field_2._M_local_buf[0] = '\0';
          local_1c8.mMorphWeight._M_dataplus._M_p = (pointer)&local_1c8.mMorphWeight.field_2;
          local_1c8.mMorphWeight.field_2._M_local_buf[0] = '\0';
          local_1c8.mMeshId._M_dataplus._M_p = (pointer)&local_1c8.mMeshId.field_2;
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>_>
                   ::operator[](&this->mControllerLibrary,&kStack_1e8);
          Collada::Controller::operator=(pmVar4,&local_1c8);
          Collada::Controller::~Controller(&local_1c8);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>_>
                   ::operator[](&this->mControllerLibrary,&kStack_1e8);
          ReadController(this,pmVar4);
          std::__cxx11::string::~string((string *)&kStack_1e8);
        }
        else {
          SkipElement(this);
        }
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar2 != 2);
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"library_controllers");
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)&local_1c8,"Expected end of <library_controllers> element.",
                 (allocator *)&kStack_1e8);
      ThrowException(this,(string *)&local_1c8);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadControllerLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("controller"))
            {
                // read ID. Ask the spec if it's necessary or optional... you might be surprised.
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                mControllerLibrary[id] = Controller();

                // read on from there
                ReadController(mControllerLibrary[id]);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "library_controllers") != 0)
                ThrowException("Expected end of <library_controllers> element.");

            break;
        }
    }
}